

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O0

void __thiscall jbcoin::STPathSet::STPathSet(STPathSet *this,SerialIter *sit,SField *name)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  uint160 local_474;
  uint160 local_460;
  uint160 local_44c;
  undefined1 local_438 [8];
  AccountID issuer;
  Currency currency;
  AccountID account;
  int hasIssuer;
  int hasCurrency;
  int hasAccount;
  Stream local_3e8;
  ScopedStream local_3d8;
  Stream local_248;
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> local_238;
  STPath local_220;
  Stream local_200;
  ScopedStream local_1f0;
  Stream local_60 [2];
  uint local_3c;
  undefined1 local_38 [4];
  int iType;
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> path;
  SField *name_local;
  SerialIter *sit_local;
  STPathSet *this_local;
  
  path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)name;
  STBase::STBase(&this->super_STBase,name);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STPathSet_0051a120;
  std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::vector(&this->value);
  std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::vector
            ((vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)local_38);
  do {
    while( true ) {
      bVar1 = SerialIter::get8(sit);
      local_3c = (uint)bVar1;
      if ((local_3c == 0) || (local_3c == 0xff)) break;
      if ((bVar1 & 0xce) != 0) {
        debugLog();
        beast::Journal::error((Journal *)&local_248);
        bVar2 = beast::Journal::Stream::operator_cast_to_bool(&local_248);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          debugLog();
          beast::Journal::error((Journal *)&local_3e8);
          beast::Journal::Stream::operator<<
                    (&local_3d8,&local_3e8,(char (*) [18])"Bad path element ");
          poVar3 = beast::Journal::ScopedStream::operator<<(&local_3d8,(int *)&local_3c);
          std::operator<<(poVar3," in pathset");
          beast::Journal::ScopedStream::~ScopedStream(&local_3d8);
        }
        Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"bad path element");
      }
      account.pn[4] = local_3c & 0x10;
      account.pn[3] = local_3c & 0x20;
      base_uint<160UL,_jbcoin::detail::AccountIDTag>::base_uint
                ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(currency.pn + 3));
      base_uint<160UL,_jbcoin::detail::CurrencyTag>::base_uint
                ((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)(issuer.pn + 3));
      base_uint<160UL,_jbcoin::detail::AccountIDTag>::base_uint
                ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)local_438);
      if ((bVar1 & 1) != 0) {
        SerialIter::get160(&local_44c,sit);
        base_uint<160UL,_jbcoin::detail::AccountIDTag>::copyFrom<void>
                  ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(currency.pn + 3),&local_44c);
      }
      if (account.pn[4] != 0) {
        SerialIter::get160(&local_460,sit);
        base_uint<160UL,_jbcoin::detail::CurrencyTag>::copyFrom<void>
                  ((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)(issuer.pn + 3),&local_460);
      }
      if (account.pn[3] != 0) {
        SerialIter::get160(&local_474,sit);
        base_uint<160UL,_jbcoin::detail::AccountIDTag>::copyFrom<void>
                  ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)local_438,&local_474);
      }
      std::vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>>::
      emplace_back<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>&,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,int&>
                ((vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>> *)local_38,
                 (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(currency.pn + 3),
                 (base_uint<160UL,_jbcoin::detail::CurrencyTag> *)(issuer.pn + 3),
                 (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)local_438,(int *)(account.pn + 4)
                );
    }
    bVar2 = std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::empty
                      ((vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)
                       local_38);
    if (bVar2) {
      debugLog();
      beast::Journal::error((Journal *)local_60);
      bVar2 = beast::Journal::Stream::operator_cast_to_bool(local_60);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        debugLog();
        beast::Journal::error((Journal *)&local_200);
        beast::Journal::Stream::operator<<
                  (&local_1f0,&local_200,(char (*) [22])"Empty path in pathset");
        beast::Journal::ScopedStream::~ScopedStream(&local_1f0);
      }
      Throw<std::runtime_error,char_const(&)[11]>((char (*) [11])"empty path");
    }
    std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::vector
              (&local_238,
               (vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)local_38);
    STPath::STPath(&local_220,&local_238);
    push_back(this,&local_220);
    STPath::~STPath(&local_220);
    std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::~vector(&local_238);
    std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::clear
              ((vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)local_38);
  } while (local_3c != 0);
  std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::~vector
            ((vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)local_38);
  return;
}

Assistant:

STPathSet::STPathSet (SerialIter& sit, SField const& name)
    : STBase(name)
{
    std::vector<STPathElement> path;
    for(;;)
    {
        int iType = sit.get8 ();

        if (iType == STPathElement::typeNone ||
            iType == STPathElement::typeBoundary)
        {
            if (path.empty ())
            {
                JLOG (debugLog().error())
                    << "Empty path in pathset";
                Throw<std::runtime_error> ("empty path");
            }

            push_back (path);
            path.clear ();

            if (iType == STPathElement::typeNone)
                return;
        }
        else if (iType & ~STPathElement::typeAll)
        {
            JLOG (debugLog().error())
                << "Bad path element " << iType << " in pathset";
            Throw<std::runtime_error> ("bad path element");
        }
        else
        {
            auto hasAccount = iType & STPathElement::typeAccount;
            auto hasCurrency = iType & STPathElement::typeCurrency;
            auto hasIssuer = iType & STPathElement::typeIssuer;

            AccountID account;
            Currency currency;
            AccountID issuer;

            if (hasAccount)
                account.copyFrom (sit.get160 ());

            if (hasCurrency)
                currency.copyFrom (sit.get160 ());

            if (hasIssuer)
                issuer.copyFrom (sit.get160 ());

            path.emplace_back (account, currency, issuer, hasCurrency);
        }
    }
}